

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalGetThreadPriority(CPalThread *pThread,HANDLE hThread,int *piPriority)

{
  int iVar1;
  IPalObject *local_38;
  IPalObject *pobjThread;
  CPalThread *pTargetThread;
  int *piStack_20;
  PAL_ERROR palError;
  int *piPriority_local;
  HANDLE hThread_local;
  CPalThread *pThread_local;
  
  pTargetThread._4_4_ = 0;
  local_38 = (IPalObject *)0x0;
  piStack_20 = piPriority;
  piPriority_local = (int *)hThread;
  hThread_local = pThread;
  pTargetThread._4_4_ =
       InternalGetThreadDataFromHandle(pThread,hThread,0,(CPalThread **)&pobjThread,&local_38);
  if (pTargetThread._4_4_ == 0) {
    CPalThread::Lock((CPalThread *)pobjThread,(CPalThread *)hThread_local);
    iVar1 = CPalThread::GetThreadPriority((CPalThread *)pobjThread);
    *piStack_20 = iVar1;
    CPalThread::Unlock((CPalThread *)pobjThread,(CPalThread *)hThread_local);
  }
  if (local_38 != (IPalObject *)0x0) {
    (*local_38->_vptr_IPalObject[8])(local_38,hThread_local);
  }
  return pTargetThread._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalGetThreadPriority(
    CPalThread *pThread,
    HANDLE hThread,
    int *piPriority
    )
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pTargetThread;
    IPalObject *pobjThread = NULL;

    palError = InternalGetThreadDataFromHandle(
        pThread,
        hThread,
        0,  // THREAD_QUERY_INFORMATION
        &pTargetThread,
        &pobjThread
        );

    if (NO_ERROR != palError)
    {
        goto InternalGetThreadPriorityExit;
    }

    pTargetThread->Lock(pThread);

    *piPriority = pTargetThread->GetThreadPriority();

    pTargetThread->Unlock(pThread);

InternalGetThreadPriorityExit:

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    return palError;
}